

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  clock_t cVar1;
  string local_118 [32];
  string local_f8 [32];
  clock_t local_d8;
  clock_t end_time;
  string local_c8 [8];
  string answer_file;
  allocator local_a1;
  string local_a0 [8];
  string predict_file;
  allocator local_79;
  string local_78 [8];
  string test_file;
  allocator local_41;
  string local_40 [8];
  string train_file;
  clock_t start_time;
  char **argv_local;
  int argc_local;
  
  cVar1 = clock();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"../data/train_data.txt",&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"../data/test_data2.txt",&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"../data/result.txt",&local_a1);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"../data/answer.txt",(allocator *)((long)&end_time + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&end_time + 7));
  Train((string *)local_40);
  Predict((string *)local_78,(string *)local_a0);
  local_d8 = clock();
  printf(anon_var_dwarf_8860,(double)(local_d8 - cVar1) / 1000000.0);
  std::__cxx11::string::string(local_f8,local_c8);
  std::__cxx11::string::string(local_118,local_a0);
  Test((string *)local_f8,(string *)local_118);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string(local_a0);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return 0;
}

Assistant:

int main (int argc, char *argv[]) {

#ifdef TEST
    clock_t start_time = clock() ;
#endif


#ifdef TEST // 线下测试用的数据路径
    string train_file = "../data/train_data.txt";
    string test_file = "../data/test_data2.txt";
    string predict_file = "../data/result.txt";
    string answer_file = "../data/answer.txt";
#else // 提交到线上，官方要求的数据路径
    string train_file = "/data/train_data.txt";
    string test_file = "/data/test_data.txt";
    string predict_file = "/projects/student/result.txt";
    string answer_file = "/projects/student/answer.txt";
#endif


    Train(train_file);

    Predict(test_file, predict_file);


#ifdef TEST
    clock_t end_time = clock();
    printf("总耗时（s）: %f \n", (double) (end_time - start_time) / CLOCKS_PER_SEC);
#endif

#ifdef TEST
    Test(answer_file, predict_file);
#endif
}